

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

value_type __thiscall
jsoncons::jsonpath::detail::
keys_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::evaluate(keys_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *args,error_code *ec)

{
  char *pcVar1;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this_00;
  bool bVar2;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar3;
  error_code *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  _Var5;
  value_type vVar6;
  semantic_tag local_91;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *local_90;
  pointer local_88;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> arg0;
  object_range_type local_70;
  key_type s;
  
  pcVar1 = *(char **)ec;
  if ((pointer)(((long)ec->_M_cat - (long)pcVar1) / 0x18) ==
      (args->
      super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    if (*pcVar1 == '\0') {
      pbVar3 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
                (pcVar1 + 8);
    }
    else {
      pbVar3 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               (pcVar1 + 8);
    }
    local_90 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)this;
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              (&arg0,pbVar3);
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                      (&arg0);
    this_00 = local_90;
    if (bVar2) {
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 local_90,0,args + 1);
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::reserve
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 this_00,((long)ec->_M_cat - *(long *)ec) / 0x18);
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      object_range_abi_cxx11_
                (&local_70,
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)&arg0);
      _Var5._M_current = local_70.first_.it_._M_current;
      while( true ) {
        bVar2 = local_70.first_.has_value_ == local_70.last_.has_value_;
        if ((local_70.first_.has_value_ & local_70.last_.has_value_ & 1U) != 0) {
          bVar2 = _Var5._M_current == local_70.last_.it_._M_current;
        }
        this = (keys_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_90;
        if (bVar2) break;
        std::__cxx11::string::string((string *)&s,(string *)_Var5._M_current);
        local_88 = s._M_dataplus._M_p;
        local_91 = none;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        emplace_back<char_const*,jsoncons::semantic_tag>(local_90,&local_88,&local_91);
        std::__cxx11::string::~string((string *)&s);
        _Var5._M_current = _Var5._M_current + 1;
      }
    }
    else {
      std::error_code::operator=(in_RCX,invalid_type);
      pbVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
      this = (keys_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)local_90;
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 local_90,pbVar3);
    }
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json(&arg0);
    uVar4 = extraout_RDX_00;
  }
  else {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               pbVar3);
    uVar4 = extraout_RDX;
  }
  vVar6.field_0.int64_.val_ = uVar4;
  vVar6.field_0._0_8_ = this;
  return (value_type)vVar6.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0 = args[0].value();
            if (!arg0.is_object())
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }

            value_type result(json_array_arg, semantic_tag::none, alloc_);
            result.reserve(args.size());

            for (auto& item : arg0.object_range())
            {
                auto s = item.key();
                result.emplace_back(s.c_str(), semantic_tag::none);
            }
            return result;
        }